

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

Expression * __thiscall
soul::ResolutionPass::TypeResolver::visit(TypeResolver *this,TypeMetaFunction *c)

{
  Allocator *pAVar1;
  ErrorIgnoringRewritingASTVisitor *pEVar2;
  bool bVar3;
  QualifiedIdentifier *args;
  CompileMessage local_150;
  bool local_111;
  string *local_110;
  IdentifierPath local_108;
  QualifiedIdentifier *local_b0;
  QualifiedIdentifier *qi;
  string *local_98;
  Identifier name;
  CommaSeparatedList *argList;
  Type local_38;
  TypeResolver *local_20;
  TypeMetaFunction *c_local;
  TypeResolver *this_local;
  
  local_20 = (TypeResolver *)c;
  c_local = (TypeMetaFunction *)this;
  RewritingASTVisitor::visit((RewritingASTVisitor *)this,c);
  bVar3 = AST::isResolvedAsType((Expression *)local_20);
  if (bVar3) {
    pAVar1 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
    pEVar2 = &local_20->super_ErrorIgnoringRewritingASTVisitor;
    (*(((Statement *)&(local_20->super_ErrorIgnoringRewritingASTVisitor).super_RewritingASTVisitor)
      ->super_ASTObject)._vptr_ASTObject[5])();
    this_local = (TypeResolver *)
                 AST::Allocator::allocate<soul::AST::ConcreteType,soul::AST::Context&,soul::Type>
                           (pAVar1,(Context *)&pEVar2->owner,&local_38);
    Type::~Type(&local_38);
  }
  else {
    bVar3 = AST::isResolvedAsValue((Expression *)local_20);
    if (bVar3) {
      pAVar1 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
      pEVar2 = &local_20->super_ErrorIgnoringRewritingASTVisitor;
      AST::TypeMetaFunction::getResultValue((Value *)&argList,(TypeMetaFunction *)local_20);
      this_local = (TypeResolver *)
                   AST::Allocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                             (pAVar1,(Context *)&pEVar2->owner,(Value *)&argList);
      soul::Value::~Value((Value *)&argList);
    }
    else {
      bVar3 = AST::TypeMetaFunction::isSizeOfUnsizedType((TypeMetaFunction *)local_20);
      if (bVar3) {
        name.name = (string *)
                    AST::Allocator::allocate<soul::AST::CommaSeparatedList,soul::AST::Context&>
                              ((this->super_ErrorIgnoringRewritingASTVisitor).allocator,
                               (Context *)&(local_20->super_ErrorIgnoringRewritingASTVisitor).owner)
        ;
        ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
                  (&((CommaSeparatedList *)name.name)->items,
                   (pool_ref<soul::AST::Expression> *)
                   &(local_20->super_ErrorIgnoringRewritingASTVisitor).ignoreErrors);
        pAVar1 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&qi,"get_array_size");
        local_110 = (string *)Identifier::Pool::get(&pAVar1->identifiers,_qi);
        pAVar1 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
        pEVar2 = &local_20->super_ErrorIgnoringRewritingASTVisitor;
        local_98 = local_110;
        IdentifierPath::IdentifierPath(&local_108,(Identifier)local_110);
        args = AST::Allocator::
               allocate<soul::AST::QualifiedIdentifier,soul::AST::Context&,soul::IdentifierPath>
                         (pAVar1,(Context *)&pEVar2->owner,&local_108);
        IdentifierPath::~IdentifierPath(&local_108);
        local_111 = true;
        local_b0 = args;
        this_local = (TypeResolver *)
                     AST::Allocator::
                     allocate<soul::AST::CallOrCast,soul::AST::QualifiedIdentifier&,soul::AST::CommaSeparatedList&,bool>
                               ((this->super_ErrorIgnoringRewritingASTVisitor).allocator,args,
                                (CommaSeparatedList *)name.name,&local_111);
      }
      else {
        if (((this->super_ErrorIgnoringRewritingASTVisitor).ignoreErrors & 1U) == 0) {
          AST::TypeMetaFunction::throwErrorIfUnresolved((TypeMetaFunction *)local_20);
          pEVar2 = &local_20->super_ErrorIgnoringRewritingASTVisitor;
          Errors::cannotResolveSourceType<>();
          AST::Context::throwError((Context *)&pEVar2->owner,&local_150,false);
        }
        (this->super_ErrorIgnoringRewritingASTVisitor).numFails =
             (this->super_ErrorIgnoringRewritingASTVisitor).numFails + 1;
        this_local = local_20;
      }
    }
  }
  return (Expression *)this_local;
}

Assistant:

AST::Expression& visit (AST::TypeMetaFunction& c) override
        {
            super::visit (c);

            if (AST::isResolvedAsType (c))
                return allocator.allocate<AST::ConcreteType> (c.context, c.resolveAsType());

            if (AST::isResolvedAsValue (c))
                return allocator.allocate<AST::Constant> (c.context, c.getResultValue());

            if (c.isSizeOfUnsizedType())
            {
                auto& argList = allocator.allocate<AST::CommaSeparatedList> (c.context);
                argList.items.push_back (c.source);

                auto name = allocator.identifiers.get ("get_array_size");
                auto& qi = allocator.allocate<AST::QualifiedIdentifier> (c.context, IdentifierPath (name));
                return allocator.allocate<AST::CallOrCast> (qi, argList, true);
            }

            if (ignoreErrors)
            {
                ++numFails;
            }
            else
            {
                c.throwErrorIfUnresolved();
                c.context.throwError (Errors::cannotResolveSourceType());
            }

            return c;
        }